

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O1

void __thiscall flatbuffers::ToStringVisitor::StartVector(ToStringVisitor *this)

{
  string *psVar1;
  
  psVar1 = &this->s;
  std::__cxx11::string::append((char *)psVar1);
  if (this->vector_delimited == true) {
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)(this->d)._M_dataplus._M_p);
    this->indent_level = this->indent_level + 1;
    append_indent(this);
    return;
  }
  std::__cxx11::string::append((char *)psVar1);
  return;
}

Assistant:

void StartVector() {
    s += "[";
    if (vector_delimited) {
      s += d;
      indent_level++;
      append_indent();
    } else {
      s += " ";
    }
  }